

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (CompilerGLSL *this,string *op,SPIRType *imgtype,uint32_t lod,uint32_t tex)

{
  bool bVar1;
  char *pcVar2;
  CompilerError *pCVar3;
  undefined4 in_register_0000000c;
  uint32_t in_R9D;
  char *local_248;
  char *local_238;
  bool local_211;
  byte local_1da;
  byte local_1d9;
  spirv_cross local_1b0 [32];
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined4 local_168;
  allocator local_161;
  string local_160 [8];
  string type_prefix;
  spirv_cross local_138 [6];
  bool is_es_and_depth;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  spirv_cross local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [39];
  byte local_39;
  char *pcStack_38;
  bool use_explicit_lod;
  char *type;
  uint32_t tex_local;
  uint32_t lod_local;
  SPIRType *imgtype_local;
  string *op_local;
  CompilerGLSL *this_local;
  
  _tex_local = (SPIRType *)CONCAT44(in_register_0000000c,lod);
  switch((_tex_local->image).dim) {
  case Dim1D:
    local_1d9 = 0;
    if (((_tex_local->image).arrayed & 1U) != 0) {
      local_1d9 = (byte)op[0x1d14] ^ 0xff;
    }
    pcStack_38 = "1D";
    if ((local_1d9 & 1) != 0) {
      pcStack_38 = "1DArray";
    }
    break;
  case Dim2D:
    local_1da = 0;
    if (((_tex_local->image).arrayed & 1U) != 0) {
      local_1da = (byte)op[0x1d14] ^ 0xff;
    }
    pcStack_38 = "2D";
    if ((local_1da & 1) != 0) {
      pcStack_38 = "2DArray";
    }
    break;
  case Dim3D:
    pcStack_38 = "3D";
    break;
  case DimCube:
    pcStack_38 = "Cube";
    break;
  case DimRect:
    pcStack_38 = "2DRect";
    break;
  case DimBuffer:
    pcStack_38 = "Buffer";
    break;
  case DimSubpassData:
    pcStack_38 = "2D";
    break;
  default:
    pcStack_38 = "";
  }
  type._0_4_ = in_R9D;
  type._4_4_ = tex;
  imgtype_local = imgtype;
  op_local = op;
  this_local = this;
  local_39 = check_explicit_lod_allowed((CompilerGLSL *)op,tex);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureLod");
  if ((((bVar1) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProjLod"), bVar1)) ||
      (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)imgtype_local,"textureGrad"), bVar1)) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProjGrad"), bVar1)) {
    bVar1 = is_legacy_es((CompilerGLSL *)op);
    if (bVar1) {
      if ((local_39 & 1) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_60,"GL_EXT_shader_texture_lod",&local_61);
        require_extension_internal((CompilerGLSL *)op,(string *)local_60);
        ::std::__cxx11::string::~string(local_60);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
    }
    else {
      bVar1 = is_legacy((CompilerGLSL *)op);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_98,"GL_ARB_shader_texture_lod",&local_99);
        require_extension_internal((CompilerGLSL *)op,(string *)local_98);
        ::std::__cxx11::string::~string(local_98);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
    }
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureLodOffset");
  if ((bVar1) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProjLodOffset"), bVar1)) {
    bVar1 = is_legacy_es((CompilerGLSL *)op);
    if (bVar1) {
      local_c1 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          imgtype_local,(char (*) [26])" not allowed in legacy ES");
      CompilerError::CompilerError(pCVar3,(string *)local_c0);
      local_c1 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"GL_EXT_gpu_shader4",&local_e9);
    require_extension_internal((CompilerGLSL *)op,(string *)local_e8);
    ::std::__cxx11::string::~string(local_e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  bVar1 = Compiler::image_is_comparison((Compiler *)op,_tex_local,(uint32_t)type);
  if ((bVar1) && (bVar1 = is_legacy_es((CompilerGLSL *)op), bVar1)) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"texture");
    if ((!bVar1) &&
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProj"), !bVar1)) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                (local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)imgtype_local,
                 (char (*) [44])" not allowed on depth samplers in legacy ES");
      CompilerError::CompilerError(pCVar3,(string *)local_138);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_110,"GL_EXT_shadow_samplers",&local_111);
    require_extension_internal((CompilerGLSL *)op,(string *)local_110);
    ::std::__cxx11::string::~string(local_110);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  bVar1 = is_legacy_es((CompilerGLSL *)op);
  local_211 = false;
  if (bVar1) {
    local_211 = Compiler::image_is_comparison((Compiler *)op,_tex_local,(uint32_t)type);
  }
  bVar1 = Compiler::image_is_comparison((Compiler *)op,_tex_local,(uint32_t)type);
  pcVar2 = "texture";
  if (bVar1) {
    pcVar2 = "shadow";
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_160,pcVar2,&local_161);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"texture");
  if (bVar1) {
    if (local_211 == false) {
      join<std::__cxx11::string&,char_const*&>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &stack0xffffffffffffffc8);
    }
    else {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &stack0xffffffffffffffc8,(char (*) [4])0x4dd210);
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"textureLod");
    if (bVar1) {
      if ((local_39 & 1) == 0) {
        join<std::__cxx11::string&,char_const*&>
                  ((spirv_cross *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &stack0xffffffffffffffc8);
      }
      else {
        bVar1 = is_legacy_es((CompilerGLSL *)op);
        local_170 = "Lod";
        if (bVar1) {
          local_170 = "LodEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((spirv_cross *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &stack0xffffffffffffffc8,&local_170);
      }
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProj");
      if (bVar1) {
        local_178 = "Proj";
        if (local_211 != false) {
          local_178 = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((spirv_cross *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &stack0xffffffffffffffc8,&local_178);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureGrad");
        if (bVar1) {
          bVar1 = is_legacy_es((CompilerGLSL *)op);
          if (bVar1) {
            local_238 = "GradEXT";
          }
          else {
            bVar1 = is_legacy_desktop((CompilerGLSL *)op);
            local_238 = "Grad";
            if (bVar1) {
              local_238 = "GradARB";
            }
          }
          local_180 = local_238;
          join<std::__cxx11::string&,char_const*&,char_const*>
                    ((spirv_cross *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     &stack0xffffffffffffffc8,&local_180);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)imgtype_local,"textureProjLod");
          if (bVar1) {
            if ((local_39 & 1) == 0) {
              join<std::__cxx11::string&,char_const*&,char_const(&)[5]>
                        ((spirv_cross *)this,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,&stack0xffffffffffffffc8,(char (*) [5])0x4db3d5);
            }
            else {
              bVar1 = is_legacy_es((CompilerGLSL *)op);
              local_188 = "ProjLod";
              if (bVar1) {
                local_188 = "ProjLodEXT";
              }
              join<std::__cxx11::string&,char_const*&,char_const*>
                        ((spirv_cross *)this,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,&stack0xffffffffffffffc8,&local_188);
            }
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)imgtype_local,"textureLodOffset");
            if (bVar1) {
              if ((local_39 & 1) == 0) {
                join<std::__cxx11::string&,char_const*&>
                          ((spirv_cross *)this,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_160,&stack0xffffffffffffffc8);
              }
              else {
                join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                          ((spirv_cross *)this,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_160,&stack0xffffffffffffffc8,(char (*) [10])0x4db3b6);
              }
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)imgtype_local,"textureProjGrad");
              if (bVar1) {
                bVar1 = is_legacy_es((CompilerGLSL *)op);
                if (bVar1) {
                  local_248 = "ProjGradEXT";
                }
                else {
                  bVar1 = is_legacy_desktop((CompilerGLSL *)op);
                  local_248 = "ProjGrad";
                  if (bVar1) {
                    local_248 = "ProjGradARB";
                  }
                }
                local_190 = local_248;
                join<std::__cxx11::string&,char_const*&,char_const*>
                          ((spirv_cross *)this,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_160,&stack0xffffffffffffffc8,&local_190);
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)imgtype_local,"textureProjLodOffset");
                if (!bVar1) {
                  pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                  join<char_const(&)[32],std::__cxx11::string_const&>
                            (local_1b0,(char (*) [32])"Unsupported legacy texture op: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             imgtype_local);
                  CompilerError::CompilerError(pCVar3,(string *)local_1b0);
                  __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
                }
                if ((local_39 & 1) == 0) {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[11]>
                            ((spirv_cross *)this,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160,&stack0xffffffffffffffc8,(char (*) [11])0x4db42b);
                }
                else {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                            ((spirv_cross *)this,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160,&stack0xffffffffffffffc8,(char (*) [14])0x4db416);
                }
              }
            }
          }
        }
      }
    }
  }
  local_168 = 1;
  ::std::__cxx11::string::~string(local_160);
  return this;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t lod, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	bool use_explicit_lod = check_explicit_lod_allowed(lod);

	if (op == "textureLod" || op == "textureProjLod" || op == "textureGrad" || op == "textureProjGrad")
	{
		if (is_legacy_es())
		{
			if (use_explicit_lod)
				require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	if (image_is_comparison(imgtype, tex) && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	bool is_es_and_depth = is_legacy_es() && image_is_comparison(imgtype, tex);
	std::string type_prefix = image_is_comparison(imgtype, tex) ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "LodEXT" : "Lod");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "ProjLodEXT" : "ProjLod");
		else
			return join(type_prefix, type, "Proj");
	}
	else if (op == "textureLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "LodOffset");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "ProjLodOffset");
		else
			return join(type_prefix, type, "ProjOffset");
	}
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}